

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O0

IterateResult __thiscall gl4cts::KHRDebug::LabelsTest::iterate(LabelsTest *this)

{
  GLenum GVar1;
  int iVar2;
  TestError *pTVar3;
  TestContext *this_00;
  EVP_PKEY_CTX *in_RSI;
  exception *exc;
  GLsizei local_4c;
  char acStack_48 [4];
  GLsizei length;
  GLchar buffer [32];
  GLuint id;
  GLenum identifier;
  labelsTestCase *test_case;
  size_t test_case_index;
  LabelsTest *this_local;
  
  TestBase::init(&this->super_TestBase,in_RSI);
  test_case = (labelsTestCase *)0x0;
  while( true ) {
    if ((labelsTestCase *)0xa < test_case) {
      this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
      TestBase::done(&this->super_TestBase);
      return STOP;
    }
    buffer._28_4_ = iterate::test_cases[(long)test_case].m_identifier;
    buffer._24_4_ =
         (*iterate::test_cases[(long)test_case].m_create)
                   ((this->super_TestBase).m_gl,(this->super_TestBase).m_rc);
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    builtin_strncpy(acStack_48,"Hell",4);
    length._0_1_ = 'o';
    length._1_1_ = 'W';
    length._2_1_ = 'o';
    length._3_1_ = 'r';
    buffer[0] = 'l';
    buffer[1] = 'd';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (buffer._28_4_,buffer._24_4_,0x20,&local_4c,acStack_48);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2d1);
    if (local_4c != 0) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Just created object has label of length != 0",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2d5);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (acStack_48[0] != '\0') {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Just created object has not empty label",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2da);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*((this->super_TestBase).m_gl)->objectLabel)(buffer._28_4_,buffer._24_4_,-1,"foo");
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"ObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2e3);
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (buffer._28_4_,buffer._24_4_,0x20,&local_4c,acStack_48);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2e6);
    if (local_4c != 3) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Length is different than length of set label",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2ea);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    iVar2 = strcmp(acStack_48,"foo");
    if (iVar2 != 0) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Different label returned",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2ef);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_4c = 0;
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (buffer._28_4_,buffer._24_4_,0,&local_4c,(GLchar *)0x0);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2f8);
    if (local_4c != 3) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Invalid length returned when label and bufSize are set to 0",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2fc);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_4c = 0;
    strcpy(acStack_48,"HelloWorld");
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (buffer._28_4_,buffer._24_4_,2,&local_4c,acStack_48);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x308);
    if (acStack_48[0] != 'f') {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Different label returned",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x30c);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (acStack_48[1] != '\0') break;
    if (acStack_48[2] != 'l') {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"GetObjectLabel overflowed buffer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x316);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_4c = 0;
    strcpy(acStack_48,"HelloWorld");
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (buffer._28_4_,buffer._24_4_,0,&local_4c,acStack_48);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x321);
    iVar2 = strcmp(acStack_48,"HelloWorld");
    if (iVar2 != 0) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"GetObjectLabel modified buffer, bufSize set to 0",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x325);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*((this->super_TestBase).m_gl)->objectLabel)(buffer._28_4_,buffer._24_4_,-1,"");
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"ObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x32e);
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (buffer._28_4_,buffer._24_4_,0x20,&local_4c,acStack_48);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x331);
    if (local_4c != 0) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Label length is != 0, empty string was set",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x335);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (acStack_48[0] != '\0') {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Non empty label returned, empty string was set",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x33a);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*((this->super_TestBase).m_gl)->objectLabel)(buffer._28_4_,buffer._24_4_,2,(GLchar *)0x0);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"ObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x343);
    (*((this->super_TestBase).m_gl)->getObjectLabel)
              (buffer._28_4_,buffer._24_4_,0x20,&local_4c,acStack_48);
    GVar1 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar1,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x346);
    if (local_4c != 0) {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Label length is != 0, label was removed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x34a);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (acStack_48[0] != '\0') {
      pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar3,"Different label returned, label was removed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x34f);
      __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    (*iterate::test_cases[(long)test_case].m_destroy)((this->super_TestBase).m_gl,buffer._24_4_);
    test_case = (labelsTestCase *)((long)&test_case->m_identifier + 1);
  }
  pTVar3 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar3,"GetObjectLabel did not stored NULL at the end of string",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
             ,0x311);
  __cxa_throw(pTVar3,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult LabelsTest::iterate()
{
	static const labelsTestCase test_cases[] = {
		{ GL_BUFFER, createBuffer, deleteBuffer, "Buffer" },
		{ GL_FRAMEBUFFER, createFramebuffer, deleteFramebuffer, "Framebuffer" },
		{ GL_PROGRAM, createProgram, deleteProgram, "Program" },
		{ GL_PROGRAM_PIPELINE, createProgramPipeline, deleteProgramPipeline, "ProgramPipeline" },
		{ GL_QUERY, createQuery, deleteQuery, "Query" },
		{ GL_RENDERBUFFER, createRenderbuffer, deleteRenderbuffer, "Renderbuffer" },
		{ GL_SAMPLER, createSampler, deleteSampler, "Sampler" },
		{ GL_SHADER, createShader, deleteShader, "Shader" },
		{ GL_TEXTURE, createTexture, deleteTexture, "Texture" },
		{ GL_TRANSFORM_FEEDBACK, createTransformFeedback, deleteTransformFeedback, "TransformFeedback" },
		{ GL_VERTEX_ARRAY, createVertexArray, deleteVertexArray, "VertexArray" },
	};

	static const size_t n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	static const GLsizei bufSize	  = 32;
	static const GLchar  label[]	  = "foo";
	static const GLsizei label_length = (GLsizei)(sizeof(label) / sizeof(label[0]) - 1);

	/* Initialize render context */
	TestBase::init();

	/* For each test case */
	for (size_t test_case_index = 0; test_case_index < n_test_cases; ++test_case_index)
	{
		const labelsTestCase& test_case = test_cases[test_case_index];

		const GLenum identifier = test_case.m_identifier;
		const GLuint id			= test_case.m_create(m_gl, m_rc);

		try
		{
			GLchar  buffer[bufSize] = "HelloWorld";
			GLsizei length;

			/*
			 * - query label; It is expected that result will be an empty string and length
			 * will be zero;
			 */
			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != length)
			{
				TCU_FAIL("Just created object has label of length != 0");
			}

			if (0 != buffer[0])
			{
				TCU_FAIL("Just created object has not empty label");
			}

			/*
			 * - assign label to object;
			 * - query label; It is expected that result will be equal to the provided
			 * label and length will be correct;
			 */
			m_gl->objectLabel(identifier, id, -1 /* length */, label);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "ObjectLabel");

			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (label_length != length)
			{
				TCU_FAIL("Length is different than length of set label");
			}

			if (0 != strcmp(buffer, label))
			{
				TCU_FAIL("Different label returned");
			}

			/*
			 * - query length only; Correct value is expected;
			 */
			length = 0;

			m_gl->getObjectLabel(identifier, id, 0 /* bufSize */, &length, 0 /* label */);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (label_length != length)
			{
				TCU_FAIL("Invalid length returned when label and bufSize are set to 0");
			}

			/*
			 * - query label with <bufSize> less than actual length of label; It is
			 * expected that only <bufSize> characters will be stored in buffer (including
			 * NULL);
			 */
			length = 0;
			strcpy(buffer, "HelloWorld");

			m_gl->getObjectLabel(identifier, id, 2 /* bufSize */, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (buffer[0] != label[0])
			{
				TCU_FAIL("Different label returned");
			}

			if (buffer[1] != 0)
			{
				TCU_FAIL("GetObjectLabel did not stored NULL at the end of string");
			}

			if (buffer[2] != 'l')
			{
				TCU_FAIL("GetObjectLabel overflowed buffer");
			}

			/*
			 * - query label with <bufSize> equal zero; It is expected that buffer contents
			 * will not be modified;
			 */
			length = 0;
			strcpy(buffer, "HelloWorld");

			m_gl->getObjectLabel(identifier, id, 0 /* bufSize */, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != strcmp(buffer, "HelloWorld"))
			{
				TCU_FAIL("GetObjectLabel modified buffer, bufSize set to 0");
			}

			/*
			 * - assign empty string as label to object;
			 * - query label, it is expected that result will be an empty string and length
			 * will be zero;
			 */
			m_gl->objectLabel(identifier, id, -1 /* length */, "");
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "ObjectLabel");

			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != length)
			{
				TCU_FAIL("Label length is != 0, empty string was set");
			}

			if (0 != buffer[0])
			{
				TCU_FAIL("Non empty label returned, empty string was set");
			}

			/*
			 * - assign NULL as label to object;
			 * - query label, it is expected that result will be an empty string and length
			 * will be zero;
			 */
			m_gl->objectLabel(identifier, id, 2, 0 /* label */);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "ObjectLabel");

			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != length)
			{
				TCU_FAIL("Label length is != 0, label was removed");
			}

			if (0 != buffer[0])
			{
				TCU_FAIL("Different label returned, label was removed");
			}
		}
		catch (const std::exception& exc)
		{
			test_case.m_destroy(m_gl, id);

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error during test case: " << test_case.m_name << tcu::TestLog::EndMessage;

			TCU_FAIL(exc.what());
		}

		test_case.m_destroy(m_gl, id);
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	TestBase::done();

	return tcu::TestNode::STOP;
}